

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderResourceCacheGL.hpp
# Opt level: O3

bool __thiscall
Diligent::ShaderResourceCacheGL::IsTextureBound
          (ShaderResourceCacheGL *this,Uint32 CacheOffset,bool dbgIsTextureView)

{
  CachedResourceView *pCVar1;
  char (*Args_1) [48];
  bool bVar2;
  string msg;
  string local_38;
  
  Args_1 = (char (*) [48])0xaaaaaaaaaaaaaaab;
  if (CacheOffset < (uint)(((ulong)this->m_ImagesOffset - (ulong)this->m_TexturesOffset) / 0x18)) {
    pCVar1 = GetConstTexture(this,CacheOffset);
    if ((!dbgIsTextureView) && (pCVar1->pTexture != (TextureBaseGL *)0x0)) {
      FormatString<char[26],char[48]>
                (&local_38,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"dbgIsTextureView || Texture.pTexture == nullptr",Args_1);
      DebugAssertionFailed
                (local_38._M_dataplus._M_p,"IsTextureBound",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/include/ShaderResourceCacheGL.hpp"
                 ,0x108);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_38._M_dataplus._M_p != &local_38.field_2) {
        operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
      }
    }
    bVar2 = (pCVar1->pView).m_pObject != (IDeviceObject *)0x0;
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool IsTextureBound(Uint32 CacheOffset, bool dbgIsTextureView) const
    {
        if (CacheOffset >= GetTextureCount())
            return false;

        const auto& Texture = GetConstTexture(CacheOffset);
        VERIFY_EXPR(dbgIsTextureView || Texture.pTexture == nullptr);
        return Texture.pView;
    }